

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
* __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::FindHelper<long>
          (pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_unsigned_long>
           *__return_storage_ptr__,InnerMap *this,long *k,TreeIterator *it)

{
  void **ppvVar1;
  _Rb_tree<long,_std::pair<const_long,_void_*>,_std::_Select1st<std::pair<const_long,_void_*>_>,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
  *this_00;
  iterator tree_it;
  Node *pNVar2;
  uint uVar3;
  unsigned_long index;
  
  uVar3 = (uint)((this->seed_ ^ *k) * -0x61c8864680b583eb >> 0x20) & (int)this->num_buckets_ - 1U;
  index = (unsigned_long)uVar3;
  ppvVar1 = this->table_;
  pNVar2 = (Node *)ppvVar1[index];
  if (pNVar2 != (Node *)0x0) {
    if (pNVar2 == (Node *)ppvVar1[index ^ 1]) {
      index = (unsigned_long)(uVar3 & 0xfffffffe);
      this_00 = (_Rb_tree<long,_std::pair<const_long,_void_*>,_std::_Select1st<std::pair<const_long,_void_*>_>,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
                 *)ppvVar1[index];
      tree_it = std::
                _Rb_tree<long,_std::pair<const_long,_void_*>,_std::_Select1st<std::pair<const_long,_void_*>_>,_std::less<long>,_google::protobuf::internal::MapAllocator<std::pair<const_long,_void_*>_>_>
                ::find(this_00,k);
      if ((_Rb_tree_header *)tree_it._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
        if (it != (TreeIterator *)0x0) {
          it->_M_node = tree_it._M_node;
        }
        iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::iterator_base(&__return_storage_ptr__->first,(TreeIterator)tree_it._M_node,this,index);
        goto LAB_00194bd6;
      }
    }
    else {
      do {
        if (*(ulong *)pNVar2 == *k) {
          (__return_storage_ptr__->first).node_ = pNVar2;
          (__return_storage_ptr__->first).m_ = this;
          (__return_storage_ptr__->first).bucket_index_ = index;
          goto LAB_00194bd6;
        }
        pNVar2 = pNVar2->next;
      } while (pNVar2 != (Node *)0x0);
    }
  }
  (__return_storage_ptr__->first).node_ = (Node *)0x0;
  (__return_storage_ptr__->first).m_ = (InnerMap *)0x0;
  (__return_storage_ptr__->first).bucket_index_ = 0;
LAB_00194bd6:
  __return_storage_ptr__->second = index;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, size_type> FindHelper(const K& k,
                                                    TreeIterator* it) const {
      size_type b = BucketNumber(k);
      if (TableEntryIsNonEmptyList(b)) {
        Node* node = static_cast<Node*>(table_[b]);
        do {
          if (internal::TransparentSupport<Key>::Equals(node->kv.first, k)) {
            return std::make_pair(const_iterator(node, this, b), b);
          } else {
            node = node->next;
          }
        } while (node != nullptr);
      } else if (TableEntryIsTree(b)) {
        GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
        b &= ~static_cast<size_t>(1);
        Tree* tree = static_cast<Tree*>(table_[b]);
        auto tree_it = tree->find(k);
        if (tree_it != tree->end()) {
          if (it != nullptr) *it = tree_it;
          return std::make_pair(const_iterator(tree_it, this, b), b);
        }
      }
      return std::make_pair(end(), b);
    }